

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_defer_clear_tasks_for_queue(fio_task_queue_s *queue)

{
  fio_defer_queue_block_s *__s;
  fio_defer_queue_block_s *__ptr;
  fio_lock_i ret;
  
  fio_lock(&queue->lock);
  __s = &queue->static_queue;
  while (__ptr = queue->reader, __ptr != (fio_defer_queue_block_s *)0x0) {
    queue->reader = __ptr->next;
    if (__ptr != __s) {
      free(__ptr);
    }
  }
  memset(__s,0,0xfe0);
  queue->writer = __s;
  queue->reader = __s;
  LOCK();
  queue->lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static inline void fio_defer_clear_tasks_for_queue(fio_task_queue_s *queue) {
  fio_lock(&queue->lock);
  while (queue->reader) {
    fio_defer_queue_block_s *tmp = queue->reader;
    queue->reader = queue->reader->next;
    if (tmp != &queue->static_queue) {
      COUNT_DEALLOC;
      free(tmp);
    }
  }
  queue->static_queue = (fio_defer_queue_block_s){.next = NULL};
  queue->reader = queue->writer = &queue->static_queue;
  fio_unlock(&queue->lock);
}